

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoSwitches.hpp
# Opt level: O1

uint16_t __thiscall
Apple::II::VideoSwitches<Cycles>::get_row_address(VideoSwitches<Cycles> *this,int row)

{
  bool bVar1;
  GraphicsMode GVar2;
  ushort uVar3;
  short sVar4;
  short sVar5;
  
  sVar5 = ((ushort)row & 0x38) * 0x10 + (short)((uint)row >> 6) * 0x28;
  GVar2 = graphics_mode(this,row);
  bVar1 = (this->internal_).store_80;
  uVar3 = (ushort)(this->internal_).page2;
  if ((GVar2 & ~DoubleText) == HighRes) {
    sVar4 = uVar3 * 0x2000 + 0x2000;
    if (bVar1 != false) {
      sVar4 = 0x2000;
    }
    sVar5 = sVar5 + ((ushort)row & 7) * 0x400;
  }
  else {
    sVar4 = uVar3 * 0x400 + 0x400;
    if (bVar1 != false) {
      sVar4 = 0x400;
    }
  }
  return sVar5 + sVar4;
}

Assistant:

uint16_t get_row_address(int row) const {
			const int character_row = row >> 3;
			const int pixel_row = row & 7;
			const uint16_t row_address = uint16_t((character_row >> 3) * 40 + ((character_row&7) << 7));

			const GraphicsMode pixel_mode = graphics_mode(row);
			return ((pixel_mode == GraphicsMode::HighRes) || (pixel_mode == GraphicsMode::DoubleHighRes)) ?
				uint16_t(((video_page()+1) * 0x2000) + row_address + ((pixel_row&7) << 10)) :
				uint16_t(((video_page()+1) * 0x400) + row_address);
		}